

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

MSize lj_tab_len(GCtab *t)

{
  uint uVar1;
  uint uVar2;
  long in_RDI;
  MSize m;
  MSize i;
  MSize j;
  uint local_18;
  uint local_14;
  uint local_4;
  
  local_14 = *(uint *)(in_RDI + 0x18);
  if ((local_14 < 2) ||
     (*(int *)((ulong)*(uint *)(in_RDI + 8) + 4 + (ulong)(local_14 - 1) * 8) != -1)) {
    if (local_14 != 0) {
      local_14 = local_14 - 1;
    }
    if (*(int *)(in_RDI + 0x1c) == 0) {
      local_4 = local_14;
    }
    else {
      local_4 = unbound_search(t,j);
    }
  }
  else {
    local_18 = 1;
    uVar1 = local_18;
    while (local_18 = uVar1, 1 < local_14 - local_18) {
      uVar2 = local_18 + local_14 >> 1;
      uVar1 = uVar2;
      if (*(int *)((ulong)*(uint *)(in_RDI + 8) + 4 + (ulong)(uVar2 - 1) * 8) == -1) {
        uVar1 = local_18;
        local_14 = uVar2;
      }
    }
    local_4 = local_18 - 1;
  }
  return local_4;
}

Assistant:

MSize LJ_FASTCALL lj_tab_len(GCtab *t)
{
  MSize j = (MSize)t->asize;
  if (j > 1 && tvisnil(arrayslot(t, j-1))) {
    MSize i = 1;
    while (j - i > 1) {
      MSize m = (i+j)/2;
      if (tvisnil(arrayslot(t, m-1))) j = m; else i = m;
    }
    return i-1;
  }
  if (j) j--;
  if (t->hmask <= 0)
    return j;
  return unbound_search(t, j);
}